

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool __thiscall
aim_t::AimTraverse3DFloors
          (aim_t *this,divline_t *trace,intercept_t *in,int frontflag,int *planestocheck)

{
  line_t_conflict *plVar1;
  F3DFloor *pFVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  F3DFloor **ppFVar6;
  sector_t_conflict *local_120;
  TAngle<double> local_110;
  TAngle<double> local_108;
  TAngle<double> local_100;
  TAngle<double> local_f8;
  TAngle<double> local_f0;
  TAngle<double> local_e8;
  TAngle<double> local_e0;
  TAngle<double> local_d8 [2];
  TAngle<double> local_c8 [2];
  TAngle<double> local_b8;
  double local_b0;
  double ff_top;
  double ff_bottom;
  sector_t_conflict *psStack_98;
  uint k;
  sector_t_conflict *s;
  double dStack_88;
  int i;
  double dist;
  double trY;
  double trX;
  DAngle lowpitch;
  DAngle highpitch;
  F3DFloor *rover;
  line_t *li;
  secplane_t *nextbottomplane;
  secplane_t *nexttopplane;
  sector_t_conflict *nextsector;
  int *planestocheck_local;
  int frontflag_local;
  intercept_t *in_local;
  divline_t *trace_local;
  aim_t *this_local;
  
  plVar1 = (in->d).line;
  li = (line_t *)0x0;
  nextbottomplane = (secplane_t *)0x0;
  *planestocheck = this->aimdir;
  if (plVar1->backsector != (sector_t_conflict *)0x0) {
    uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&plVar1->frontsector->e->XFloor);
    if ((uVar4 != 0) ||
       (uVar4 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&plVar1->backsector->e->XFloor),
       uVar4 != 0)) {
      TAngle<double>::TAngle(&lowpitch);
      TAngle<double>::TAngle((TAngle<double> *)&trX);
      trY = trace->x + trace->dx * in->frac;
      dist = trace->y + trace->dy * in->frac;
      dStack_88 = this->attackrange * in->frac;
      for (s._4_4_ = 1; s._4_4_ < 3; s._4_4_ = s._4_4_ + 1) {
        if (s._4_4_ == 1) {
          local_120 = plVar1->frontsector;
        }
        else {
          local_120 = plVar1->backsector;
        }
        psStack_98 = local_120;
        for (ff_bottom._4_4_ = 0; uVar4 = ff_bottom._4_4_,
            uVar5 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)&psStack_98->e->XFloor),
            uVar4 < uVar5; ff_bottom._4_4_ = ff_bottom._4_4_ + 1) {
          this->crossedffloors = true;
          ppFVar6 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)&psStack_98->e->XFloor,
                               (ulong)ff_bottom._4_4_);
          pFVar2 = *ppFVar6;
          if (((pFVar2->flags & 0x4000000) == 0) && ((pFVar2->flags & 1) != 0)) {
            ff_top = secplane_t::ZatPoint((pFVar2->bottom).plane,trY,dist);
            local_b0 = secplane_t::ZatPoint((pFVar2->top).plane,trY,dist);
            VecToAngle(dStack_88,local_b0 - this->shootz);
            TAngle<double>::operator-(&local_b8);
            TAngle<double>::operator=(&lowpitch,&local_b8);
            VecToAngle(dStack_88,ff_top - this->shootz);
            TAngle<double>::operator-(local_c8);
            TAngle<double>::operator=((TAngle<double> *)&trX,local_c8);
            TAngle<double>::TAngle(local_d8,&this->toppitch);
            bVar3 = TAngle<double>::operator<=(&lowpitch,local_d8);
            if (bVar3) {
              TAngle<double>::TAngle(&local_e0,&this->bottompitch);
              bVar3 = TAngle<double>::operator>=((TAngle<double> *)&trX,&local_e0);
              if (bVar3) {
                return false;
              }
              TAngle<double>::TAngle(&local_e8,&this->toppitch);
              bVar3 = TAngle<double>::operator>((TAngle<double> *)&trX,&local_e8);
              if ((bVar3) &&
                 (TAngle<double>::operator=(&this->toppitch,(TAngle<double> *)&trX),
                 frontflag != s._4_4_ + -1)) {
                nextbottomplane = (pFVar2->bottom).plane;
                *planestocheck = *planestocheck & 0xfffffffe;
              }
            }
            else {
              TAngle<double>::TAngle(&local_f0,&this->bottompitch);
              bVar3 = TAngle<double>::operator>=((TAngle<double> *)&trX,&local_f0);
              if (bVar3) {
                TAngle<double>::TAngle(&local_f8,&this->bottompitch);
                bVar3 = TAngle<double>::operator<(&lowpitch,&local_f8);
                if ((bVar3) &&
                   (TAngle<double>::operator=(&this->bottompitch,&lowpitch),
                   frontflag != s._4_4_ + -1)) {
                  li = (line_t *)(pFVar2->top).plane;
                  *planestocheck = *planestocheck & 0xfffffffd;
                }
              }
            }
            if ((frontflag == s._4_4_ + -1) && (psStack_98 == this->lastsector)) {
              if ((pFVar2->bottom).plane == this->lastceilingplane) {
                TAngle<double>::TAngle(&local_100,&this->toppitch);
                bVar3 = TAngle<double>::operator>((TAngle<double> *)&trX,&local_100);
                if (bVar3) {
                  TAngle<double>::operator=(&this->toppitch,(TAngle<double> *)&trX);
                }
              }
              if ((pFVar2->top).plane == this->lastfloorplane) {
                TAngle<double>::TAngle(&local_108,&this->bottompitch);
                bVar3 = TAngle<double>::operator<(&lowpitch,&local_108);
                if (bVar3) {
                  TAngle<double>::operator=(&this->bottompitch,&lowpitch);
                }
              }
            }
            TAngle<double>::TAngle(&local_110,&this->bottompitch);
            bVar3 = TAngle<double>::operator>=(&this->toppitch,&local_110);
            if (bVar3) {
              return false;
            }
          }
        }
      }
    }
    this->lastsector = (sector_t_conflict *)0x0;
    this->lastceilingplane = nextbottomplane;
    this->lastfloorplane = (secplane_t *)li;
  }
  return true;
}

Assistant:

bool AimTraverse3DFloors(const divline_t &trace, intercept_t * in, int frontflag, int *planestocheck)
	{
		sector_t * nextsector;
		secplane_t * nexttopplane, *nextbottomplane;
		line_t * li = in->d.line;

		nextsector = NULL;
		nexttopplane = nextbottomplane = NULL;
		*planestocheck = aimdir;

		if (li->backsector == NULL) return true;	// shouldn't really happen but crashed once for me...
		if (li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
		{
			F3DFloor* rover;
			DAngle highpitch, lowpitch;

			double trX = trace.x + trace.dx * in->frac;
			double trY = trace.y + trace.dy * in->frac;
			double dist = attackrange * in->frac;

			// 3D floor check. This is not 100% accurate but normally sufficient when
			// combined with a final sight check
			for (int i = 1; i <= 2; i++)
			{
				sector_t * s = i == 1 ? li->frontsector : li->backsector;

				for (unsigned k = 0; k < s->e->XFloor.ffloors.Size(); k++)
				{
					crossedffloors = true;
					rover = s->e->XFloor.ffloors[k];

					if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

					double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
					double ff_top = rover->top.plane->ZatPoint(trX, trY);


					highpitch = -VecToAngle(dist, ff_top - shootz);
					lowpitch = -VecToAngle(dist, ff_bottom - shootz);

					if (highpitch <= toppitch)
					{
						// blocks completely
						if (lowpitch >= bottompitch) return false;
						// blocks upper edge of view
						if (lowpitch > toppitch)
						{
							toppitch = lowpitch;
							if (frontflag != i - 1)
							{
								nexttopplane = rover->bottom.plane;
								*planestocheck &= ~aim_up;
							}
						}
					}
					else if (lowpitch >= bottompitch)
					{
						// blocks lower edge of view
						if (highpitch < bottompitch)
						{
							bottompitch = highpitch;
							if (frontflag != i - 1)
							{
								nextbottomplane = rover->top.plane;
								*planestocheck &= ~aim_down;
							}
						}
					}
					// trace is leaving a sector with a 3d-floor

					if (frontflag == i - 1)
					{
						if (s == lastsector)
						{
							// upper slope intersects with this 3d-floor
							if (rover->bottom.plane == lastceilingplane && lowpitch > toppitch)
							{
								toppitch = lowpitch;
							}
							// lower slope intersects with this 3d-floor
							if (rover->top.plane == lastfloorplane && highpitch < bottompitch)
							{
								bottompitch = highpitch;
							}
						}
					}
					if (toppitch >= bottompitch) return false;		// stop
				}
			}
		}

		lastsector = nextsector;
		lastceilingplane = nexttopplane;
		lastfloorplane = nextbottomplane;
		return true;
	}